

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pybind11.h
# Opt level: O0

void __thiscall
pybind11::cpp_function::
initialize<unsigned_long(*&)(unsigned_long,Eigen::Matrix<unsigned_long,1,2,1,1,2>),unsigned_long,unsigned_long,Eigen::Matrix<unsigned_long,1,2,1,1,2>,pybind11::name,pybind11::scope,pybind11::sibling>
          (cpp_function *this,
          _func_unsigned_long_unsigned_long_Matrix<unsigned_long,_1,_2,_1,_1,_2> **f,
          _func_unsigned_long_unsigned_long_Matrix<unsigned_long,_1,_2,_1,_1,_2> *param_2,
          name *extra,scope *extra_1,sibling *extra_2)

{
  function_record *rec_00;
  _func_handle_function_call_ptr *p_Var1;
  const_pointer types;
  _lambda_pybind11__detail__function_call___1_ local_41;
  bool is_function_ptr;
  function_record *pfStack_40;
  function_record *rec;
  sibling *extra_local_2;
  scope *extra_local_1;
  name *extra_local;
  _func_unsigned_long_unsigned_long_Matrix<unsigned_long,_1,_2,_1,_1,_2> *param_5_local;
  _func_unsigned_long_unsigned_long_Matrix<unsigned_long,_1,_2,_1,_1,_2> **f_local;
  cpp_function *this_local;
  
  rec = (function_record *)extra_2;
  extra_local_2 = (sibling *)extra_1;
  extra_local_1 = (scope *)extra;
  extra_local = (name *)param_2;
  param_5_local = (_func_unsigned_long_unsigned_long_Matrix<unsigned_long,_1,_2,_1,_1,_2> *)f;
  f_local = (_func_unsigned_long_unsigned_long_Matrix<unsigned_long,_1,_2,_1,_1,_2> **)this;
  pfStack_40 = make_function_record(this);
  pfStack_40->data[0] = *(void **)param_5_local;
  p_Var1 = initialize(unsigned_long(*&)(unsigned_long,Eigen::Matrix),unsigned_long(*)(unsigned_long,Eigen::Matrix),pybind11::name_const&,pybind11::scope_const&,pybind11::sibling_const&)
           ::{lambda(pybind11::detail::function_call&)#1}::operator_cast_to_function_pointer
                     (&local_41);
  pfStack_40->impl = p_Var1;
  detail::process_attributes<pybind11::name,_pybind11::scope,_pybind11::sibling>::init
            ((EVP_PKEY_CTX *)extra_local_1);
  rec_00 = pfStack_40;
  types = std::array<const_std::type_info_*,_1UL>::data
                    (&initialize<unsigned_long_(*&)(unsigned_long,_Eigen::Matrix<unsigned_long,_1,_2,_1,_1,_2>),_unsigned_long,_unsigned_long,_Eigen::Matrix<unsigned_long,_1,_2,_1,_1,_2>,_pybind11::name,_pybind11::scope,_pybind11::sibling>
                      ::types);
  initialize_generic(this,rec_00,
                     initialize<unsigned_long_(*&)(unsigned_long,_Eigen::Matrix<unsigned_long,_1,_2,_1,_1,_2>),_unsigned_long,_unsigned_long,_Eigen::Matrix<unsigned_long,_1,_2,_1,_1,_2>,_pybind11::name,_pybind11::scope,_pybind11::sibling>
                     ::signature.text,types,2);
  pfStack_40->field_0x59 = pfStack_40->field_0x59 & 0xfb | 4;
  pfStack_40->data[1] =
       &(*)(unsigned_long,Eigen::Matrix<unsigned_long,int,int,int,int,int>)::typeinfo;
  return;
}

Assistant:

void initialize(Func &&f, Return (*)(Args...), const Extra&... extra) {
        using namespace detail;
        struct capture { remove_reference_t<Func> f; };

        /* Store the function including any extra state it might have (e.g. a lambda capture object) */
        auto rec = make_function_record();

        /* Store the capture object directly in the function record if there is enough space */
        if (sizeof(capture) <= sizeof(rec->data)) {
            /* Without these pragmas, GCC warns that there might not be
               enough space to use the placement new operator. However, the
               'if' statement above ensures that this is the case. */
#if defined(__GNUG__) && !defined(__clang__) && __GNUC__ >= 6
#  pragma GCC diagnostic push
#  pragma GCC diagnostic ignored "-Wplacement-new"
#endif
            new ((capture *) &rec->data) capture { std::forward<Func>(f) };
#if defined(__GNUG__) && !defined(__clang__) && __GNUC__ >= 6
#  pragma GCC diagnostic pop
#endif
            if (!std::is_trivially_destructible<Func>::value)
                rec->free_data = [](function_record *r) { ((capture *) &r->data)->~capture(); };
        } else {
            rec->data[0] = new capture { std::forward<Func>(f) };
            rec->free_data = [](function_record *r) { delete ((capture *) r->data[0]); };
        }

        /* Type casters for the function arguments and return value */
        using cast_in = argument_loader<Args...>;
        using cast_out = make_caster<
            conditional_t<std::is_void<Return>::value, void_type, Return>
        >;

        static_assert(expected_num_args<Extra...>(sizeof...(Args), cast_in::has_args, cast_in::has_kwargs),
                      "The number of argument annotations does not match the number of function arguments");

        /* Dispatch code which converts function arguments and performs the actual function call */
        rec->impl = [](function_call &call) -> handle {
            cast_in args_converter;

            /* Try to cast the function arguments into the C++ domain */
            if (!args_converter.load_args(call))
                return PYBIND11_TRY_NEXT_OVERLOAD;

            /* Invoke call policy pre-call hook */
            process_attributes<Extra...>::precall(call);

            /* Get a pointer to the capture object */
            auto data = (sizeof(capture) <= sizeof(call.func.data)
                         ? &call.func.data : call.func.data[0]);
            capture *cap = const_cast<capture *>(reinterpret_cast<const capture *>(data));

            /* Override policy for rvalues -- usually to enforce rvp::move on an rvalue */
            return_value_policy policy = return_value_policy_override<Return>::policy(call.func.policy);

            /* Function scope guard -- defaults to the compile-to-nothing `void_type` */
            using Guard = extract_guard_t<Extra...>;

            /* Perform the function call */
            handle result = cast_out::cast(
                std::move(args_converter).template call<Return, Guard>(cap->f), policy, call.parent);

            /* Invoke call policy post-call hook */
            process_attributes<Extra...>::postcall(call, result);

            return result;
        };

        /* Process any user-provided function attributes */
        process_attributes<Extra...>::init(extra..., rec);

        /* Generate a readable signature describing the function's arguments and return value types */
        static constexpr auto signature = _("(") + cast_in::arg_names + _(") -> ") + cast_out::name;
        PYBIND11_DESCR_CONSTEXPR auto types = decltype(signature)::types();

        /* Register the function with Python from generic (non-templated) code */
        initialize_generic(rec, signature.text, types.data(), sizeof...(Args));

        if (cast_in::has_args) rec->has_args = true;
        if (cast_in::has_kwargs) rec->has_kwargs = true;

        /* Stash some additional information used by an important optimization in 'functional.h' */
        using FunctionType = Return (*)(Args...);
        constexpr bool is_function_ptr =
            std::is_convertible<Func, FunctionType>::value &&
            sizeof(capture) == sizeof(void *);
        if (is_function_ptr) {
            rec->is_stateless = true;
            rec->data[1] = const_cast<void *>(reinterpret_cast<const void *>(&typeid(FunctionType)));
        }
    }